

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::incrNextSenderMsgSeqNum(SessionState *this)

{
  Mutex::lock(&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[8])();
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    m_pStore->incrNextSenderMsgSeqNum();
  }